

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

bool pstore::command_line::details::handler_set_value
               (maybe<pstore::command_line::option_*,_void> *handler,string *value)

{
  undefined1 uVar1;
  int iVar2;
  type *ptVar3;
  option **ppoVar4;
  bool bVar5;
  maybe<pstore::command_line::option_*,_void> local_20;
  
  local_20.valid_ = false;
  bVar5 = handler->valid_ == true;
  if (bVar5) {
    ptVar3 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(handler);
    local_20.storage_ = *ptVar3;
    local_20.valid_ = bVar5;
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&local_20);
    iVar2 = (*(*ppoVar4)->_vptr_option[0xe])();
    bVar5 = local_20.valid_;
    if ((char)iVar2 != '\0') {
      if (local_20.valid_ == true) {
        local_20.valid_ = false;
      }
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(handler);
      iVar2 = (*(*ppoVar4)->_vptr_option[0x10])();
      if ((char)iVar2 == '\0') {
        uVar1 = 0;
      }
      else {
        ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(handler);
        iVar2 = (*(*ppoVar4)->_vptr_option[0xf])(*ppoVar4,value);
        uVar1 = (undefined1)iVar2;
      }
      return (bool)uVar1;
    }
  }
  local_20.valid_ = bVar5;
  assert_failed("handler_takes_argument (handler)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                ,0x55);
}

Assistant:

bool handler_set_value (maybe<option *> handler, std::string const & value) {
                    PSTORE_ASSERT (handler_takes_argument (handler));
                    if (!(*handler)->add_occurrence ()) {
                        return false;
                    }
                    return (*handler)->value (value);
                }